

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

void destroyContextOSMesa(_GLFWwindow *window)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x2a0) != 0) {
    (*_glfw.osmesa.DestroyContext)(*(OSMesaContext *)(in_RDI + 0x2a0));
    *(undefined8 *)(in_RDI + 0x2a0) = 0;
  }
  if (*(long *)(in_RDI + 0x2b0) != 0) {
    free(*(void **)(in_RDI + 0x2b0));
    *(undefined4 *)(in_RDI + 0x2a8) = 0;
    *(undefined4 *)(in_RDI + 0x2ac) = 0;
  }
  return;
}

Assistant:

static void destroyContextOSMesa(_GLFWwindow* window)
{
    if (window->context.osmesa.handle)
    {
        OSMesaDestroyContext(window->context.osmesa.handle);
        window->context.osmesa.handle = NULL;
    }

    if (window->context.osmesa.buffer)
    {
        free(window->context.osmesa.buffer);
        window->context.osmesa.width = 0;
        window->context.osmesa.height = 0;
    }
}